

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::peer_connection::peer_log
          (peer_connection *this,direction_t direction,char *event,char *fmt,...)

{
  char in_AL;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 in_R8;
  undefined8 in_R9;
  uint in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  element_type *in_XMM3_Qa;
  duration in_XMM4_Qa;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_XMM5_Qa;
  int64_t in_XMM6_Qa;
  disk_interface *in_XMM7_Qa;
  direction_t direction_local;
  torrent_handle h;
  char *fmt_local;
  char *event_local;
  undefined1 local_108 [16];
  shared_ptr<libtorrent::aux::torrent> t;
  va_list v;
  undefined1 local_c8 [32];
  peer_class_set local_a8;
  element_type *local_68;
  time_point local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  int64_t local_38;
  disk_interface *local_28;
  
  if (in_AL != '\0') {
    local_a8.m_class.
    super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
    ._M_elems[3].m_val = in_XMM0_Da;
    local_a8.m_class.
    super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
    ._M_elems._28_8_ = in_XMM1_Qa;
    local_a8.m_class.
    super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
    ._M_elems._44_8_ = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58.__d.__r = (duration)(duration)in_XMM4_Qa.__r;
    local_48._M_pi = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  direction_local = direction;
  fmt_local = fmt;
  event_local = event;
  local_a8._0_8_ = in_R8;
  local_a8.m_class.
  super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
  ._M_elems._4_8_ = in_R9;
  iVar1 = (*(((this->super_peer_connection_hot_members).m_ses)->super_session_logger).
            _vptr_session_logger[5])();
  if ((short)*(undefined4 *)(CONCAT44(extraout_var,iVar1) + 0x68) < 0) {
    v[0].reg_save_area = local_c8;
    v[0].overflow_arg_area = &stack0x00000008;
    v[0].gp_offset = 0x20;
    v[0].fp_offset = 0x30;
    h.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    h.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>,
               &(this->super_peer_connection_hot_members).m_torrent);
    if (t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      torrent::get_handle((torrent *)local_108);
      ::std::__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)&h,
                 (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)local_108);
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 8));
    }
    iVar1 = (*(((this->super_peer_connection_hot_members).m_ses)->super_session_logger).
              _vptr_session_logger[5])();
    alert_manager::
    emplace_alert<libtorrent::peer_log_alert,libtorrent::torrent_handle&,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,libtorrent::digest32<160l>const&,libtorrent::peer_log_alert::direction_t&,char_const*&,char_const*&,__va_list_tag(&)[1]>
              ((alert_manager *)CONCAT44(extraout_var_00,iVar1),&h,&this->m_remote,&this->m_peer_id,
               &direction_local,&event_local,&fmt_local,&v);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              (&h.m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return;
}

Assistant:

void peer_connection::peer_log(peer_log_alert::direction_t direction
		, char const* event, char const* fmt, ...) const noexcept try
	{
		TORRENT_ASSERT(is_single_thread());

		if (!m_ses.alerts().should_post<peer_log_alert>()) return;

		va_list v;
		va_start(v, fmt);

		torrent_handle h;
		auto t = m_torrent.lock();
		if (t) h = t->get_handle();

		m_ses.alerts().emplace_alert<peer_log_alert>(
			h, m_remote, m_peer_id, direction, event, fmt, v);

		va_end(v);

	}
	catch (std::exception const&) {}